

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int memdbLock(sqlite3_file *pFile,int eLock)

{
  sqlite3_io_methods *p_00;
  int local_34;
  int rc;
  MemStore *p;
  MemFile *pThis;
  int eLock_local;
  sqlite3_file *pFile_local;
  
  p_00 = pFile[1].pMethods;
  local_34 = 0;
  if (eLock == *(int *)&pFile[2].pMethods) {
    pFile_local._4_4_ = 0;
  }
  else {
    memdbEnter((MemStore *)p_00);
    if (eLock < 2) {
      if (eLock == 1) {
        if (*(int *)&pFile[2].pMethods < 2) {
          if (*(int *)((long)&p_00->xFileSize + 4) == 0) {
            *(int *)&p_00->xFileSize = *(int *)&p_00->xFileSize + 1;
          }
          else {
            local_34 = 5;
          }
        }
        else {
          *(int *)((long)&p_00->xFileSize + 4) = 0;
        }
      }
      else {
        if (1 < *(int *)&pFile[2].pMethods) {
          *(int *)((long)&p_00->xFileSize + 4) = 0;
        }
        *(int *)&p_00->xFileSize = *(int *)&p_00->xFileSize + -1;
      }
    }
    else if (((ulong)p_00->xSync & 0x400000000) == 0) {
      if (*(int *)&pFile[2].pMethods < 2) {
        if (*(int *)((long)&p_00->xFileSize + 4) == 0) {
          *(int *)((long)&p_00->xFileSize + 4) = 1;
        }
        else {
          local_34 = 5;
        }
      }
    }
    else {
      local_34 = 8;
    }
    if (local_34 == 0) {
      *(int *)&pFile[2].pMethods = eLock;
    }
    memdbLeave((MemStore *)p_00);
    pFile_local._4_4_ = local_34;
  }
  return pFile_local._4_4_;
}

Assistant:

static int memdbLock(sqlite3_file *pFile, int eLock){
  MemFile *pThis = (MemFile*)pFile;
  MemStore *p = pThis->pStore;
  int rc = SQLITE_OK;
  if( eLock==pThis->eLock ) return SQLITE_OK;
  memdbEnter(p);
  if( eLock>SQLITE_LOCK_SHARED ){
    if( p->mFlags & SQLITE_DESERIALIZE_READONLY ){
      rc = SQLITE_READONLY;
    }else if( pThis->eLock<=SQLITE_LOCK_SHARED ){
      if( p->nWrLock ){
        rc = SQLITE_BUSY;
      }else{
        p->nWrLock = 1;
      }
    }
  }else if( eLock==SQLITE_LOCK_SHARED ){
    if( pThis->eLock > SQLITE_LOCK_SHARED ){
      assert( p->nWrLock==1 );
      p->nWrLock = 0;
    }else if( p->nWrLock ){
      rc = SQLITE_BUSY;
    }else{
      p->nRdLock++;
    }
  }else{
    assert( eLock==SQLITE_LOCK_NONE );
    if( pThis->eLock>SQLITE_LOCK_SHARED ){
      assert( p->nWrLock==1 );
      p->nWrLock = 0;
    }
    assert( p->nRdLock>0 );
    p->nRdLock--;
  }
  if( rc==SQLITE_OK ) pThis->eLock = eLock;
  memdbLeave(p);
  return rc;
}